

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O0

bool __thiscall
cmExtraSublimeTextGenerator::Open
          (cmExtraSublimeTextGenerator *this,string *bindir,string *projectName,bool dryRun)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  cmake *this_00;
  char *pcVar2;
  duration<double,_std::ratio<1L,_1L>_> timeout;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_16c;
  undefined1 local_16b;
  allocator<char> local_16a;
  allocator<char> local_169;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string local_140 [32];
  string local_120 [32];
  iterator local_100;
  size_type local_f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0;
  undefined4 local_d4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_90 [8];
  string filename;
  allocator<char> local_59;
  string local_58;
  char *local_38;
  char *sublExecutable;
  string *psStack_28;
  bool dryRun_local;
  string *projectName_local;
  string *bindir_local;
  cmExtraSublimeTextGenerator *this_local;
  
  sublExecutable._7_1_ = dryRun;
  psStack_28 = projectName;
  projectName_local = bindir;
  bindir_local = (string *)this;
  this_00 = cmGlobalGenerator::GetCMakeInstance
                      ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"CMAKE_SUBLIMETEXT_EXECUTABLE",&local_59);
  pcVar2 = cmake::GetCacheDefinition(this_00,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  if (pcVar2 == (char *)0x0) {
    this_local._7_1_ = 0;
  }
  else {
    local_38 = pcVar2;
    bVar1 = cmSystemTools::IsNOTFOUND(pcVar2);
    if (bVar1) {
      this_local._7_1_ = 0;
    }
    else {
      std::operator+(&local_d0,projectName_local,"/");
      std::operator+(&local_b0,&local_d0,psStack_28);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                     &local_b0,".sublime-project");
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      pcVar2 = local_38;
      if ((sublExecutable._7_1_ & 1) == 0) {
        local_16b = 1;
        local_168 = &local_160;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,pcVar2,&local_169);
        local_168 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_140,"--project",&local_16a);
        local_168 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120;
        std::__cxx11::string::string((string *)local_168,(string *)local_90);
        local_16b = 0;
        local_100 = &local_160;
        local_f8 = 3;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator(&local_16c);
        __l._M_len = local_f8;
        __l._M_array = local_100;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_f0,__l,&local_16c);
        timeout = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
        this_local._7_1_ =
             cmSystemTools::RunSingleCommand
                       (&local_f0,(string *)0x0,(string *)0x0,(int *)0x0,(char *)0x0,OUTPUT_MERGE,
                        (cmDuration)timeout.__r,Auto);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_f0);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator(&local_16c);
        local_1e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100;
        do {
          local_1e0 = local_1e0 + -1;
          std::__cxx11::string::~string((string *)local_1e0);
        } while (local_1e0 != &local_160);
        std::allocator<char>::~allocator(&local_16a);
        std::allocator<char>::~allocator(&local_169);
      }
      else {
        this_local._7_1_ = cmsys::SystemTools::FileExists((string *)local_90,true);
      }
      local_d4 = 1;
      std::__cxx11::string::~string((string *)local_90);
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmExtraSublimeTextGenerator::Open(const std::string& bindir,
                                       const std::string& projectName,
                                       bool dryRun)
{
  const char* sublExecutable =
    this->GlobalGenerator->GetCMakeInstance()->GetCacheDefinition(
      "CMAKE_SUBLIMETEXT_EXECUTABLE");
  if (!sublExecutable) {
    return false;
  }
  if (cmSystemTools::IsNOTFOUND(sublExecutable)) {
    return false;
  }

  std::string filename = bindir + "/" + projectName + ".sublime-project";
  if (dryRun) {
    return cmSystemTools::FileExists(filename, true);
  }

  return cmSystemTools::RunSingleCommand(
    { sublExecutable, "--project", filename });
}